

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_ManCreateDepthClauses(Ses_Man_t *pSes)

{
  Vec_Int_t *p;
  int iVar1;
  int local_48;
  int local_40;
  int local_3c;
  int pLits [3];
  int h;
  int d;
  int kk;
  int jj;
  int k;
  int j;
  int i;
  Ses_Man_t *pSes_local;
  
  k = 0;
  do {
    if (pSes->nGates <= k) {
      return 1;
    }
    for (kk = 1; kk < k; kk = kk + 1) {
      for (jj = 0; jj < kk; jj = jj + 1) {
        iVar1 = Ses_ManSelectVar(pSes,k,pSes->nSpecVars + jj,pSes->nSpecVars + kk);
        local_40 = Abc_Var2Lit(iVar1,1);
        for (d = 0; d <= pSes->nArrTimeMax + jj; d = d + 1) {
          iVar1 = Ses_ManDepthVar(pSes,jj,d);
          local_3c = Abc_Var2Lit(iVar1,1);
          iVar1 = Ses_ManDepthVar(pSes,k,d + 1);
          pLits[0] = Abc_Var2Lit(iVar1,0);
          sat_solver_addclause(pSes->pSat,&local_40,pLits + 1);
        }
      }
    }
    for (kk = 0; kk < k; kk = kk + 1) {
      for (jj = 0; jj < pSes->nSpecVars + kk; jj = jj + 1) {
        iVar1 = Ses_ManSelectVar(pSes,k,jj,pSes->nSpecVars + kk);
        local_40 = Abc_Var2Lit(iVar1,1);
        for (h = 0; h <= pSes->nArrTimeMax + kk; h = h + 1) {
          iVar1 = Ses_ManDepthVar(pSes,kk,h);
          local_3c = Abc_Var2Lit(iVar1,1);
          iVar1 = Ses_ManDepthVar(pSes,k,h + 1);
          pLits[0] = Abc_Var2Lit(iVar1,0);
          sat_solver_addclause(pSes->pSat,&local_40,pLits + 1);
        }
      }
    }
    if (pSes->pArrTimeProfile == (int *)0x0) {
      p = pSes->vAssump;
      iVar1 = Ses_ManDepthVar(pSes,k,0);
      iVar1 = Abc_Var2Lit(iVar1,0);
      Vec_IntPush(p,iVar1);
    }
    else {
      for (kk = 1; kk < pSes->nSpecVars + k; kk = kk + 1) {
        jj = 0;
        while( true ) {
          if (kk < pSes->nSpecVars) {
            local_48 = kk;
          }
          else {
            local_48 = pSes->nSpecVars;
          }
          if (local_48 <= jj) break;
          pLits[2] = pSes->pArrTimeProfile[jj];
          if ((kk < pSes->nSpecVars) && (pLits[2] < pSes->pArrTimeProfile[kk])) {
            pLits[2] = pSes->pArrTimeProfile[kk];
          }
          iVar1 = Ses_ManSelectVar(pSes,k,jj,kk);
          local_40 = Abc_Var2Lit(iVar1,1);
          iVar1 = Ses_ManDepthVar(pSes,k,pLits[2]);
          local_3c = Abc_Var2Lit(iVar1,0);
          sat_solver_addclause(pSes->pSat,&local_40,pLits);
          jj = jj + 1;
        }
      }
    }
    for (jj = 1; jj <= pSes->nArrTimeMax + k; jj = jj + 1) {
      iVar1 = Ses_ManDepthVar(pSes,k,jj);
      local_40 = Abc_Var2Lit(iVar1,1);
      iVar1 = Ses_ManDepthVar(pSes,k,jj + -1);
      local_3c = Abc_Var2Lit(iVar1,0);
      sat_solver_addclause(pSes->pSat,&local_40,pLits);
    }
    if (pSes->nMaxDepth < pSes->nArrTimeMax + k) {
      for (pLits[1] = 0; pLits[1] < pSes->nSpecFunc; pLits[1] = pLits[1] + 1) {
        iVar1 = Ses_ManOutputVar(pSes,pLits[1],k);
        local_40 = Abc_Var2Lit(iVar1,1);
        iVar1 = Ses_ManDepthVar(pSes,k,pSes->nMaxDepth);
        local_3c = Abc_Var2Lit(iVar1,1);
        iVar1 = sat_solver_addclause(pSes->pSat,&local_40,pLits);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static int Ses_ManCreateDepthClauses( Ses_Man_t * pSes )
{
    int i, j, k, jj, kk, d, h;
    int pLits[3];

    for ( i = 0; i < pSes->nGates; ++i )
    {
        /* propagate depths from children */
        for ( k = 1; k < i; ++k )
            for ( j = 0; j < k; ++j )
            {
                pLits[0] = Abc_Var2Lit( Ses_ManSelectVar( pSes, i, pSes->nSpecVars + j, pSes->nSpecVars + k ), 1 );
                for ( jj = 0; jj <= pSes->nArrTimeMax + j; ++jj )
                {
                    pLits[1] = Abc_Var2Lit( Ses_ManDepthVar( pSes, j, jj ), 1 );
                    pLits[2] = Abc_Var2Lit( Ses_ManDepthVar( pSes, i, jj + 1 ), 0 );
                    sat_solver_addclause( pSes->pSat, pLits, pLits + 3 );
                }
            }

        for ( k = 0; k < i; ++k )
            for ( j = 0; j < pSes->nSpecVars + k; ++j )
            {
                pLits[0] = Abc_Var2Lit( Ses_ManSelectVar( pSes, i, j, pSes->nSpecVars + k ), 1 );
                for ( kk = 0; kk <= pSes->nArrTimeMax + k; ++kk )
                {
                    pLits[1] = Abc_Var2Lit( Ses_ManDepthVar( pSes, k, kk ), 1 );
                    pLits[2] = Abc_Var2Lit( Ses_ManDepthVar( pSes, i, kk + 1 ), 0 );
                    sat_solver_addclause( pSes->pSat, pLits, pLits + 3 );
                }
            }

        /* propagate depths from arrival times at PIs */
        if ( pSes->pArrTimeProfile )
        {
            for ( k = 1; k < pSes->nSpecVars + i; ++k )
                for ( j = 0; j < ( ( k < pSes->nSpecVars ) ? k : pSes->nSpecVars ); ++j )
                {
                    d = pSes->pArrTimeProfile[j];
                    if ( k < pSes->nSpecVars && pSes->pArrTimeProfile[k] > d )
                        d = pSes->pArrTimeProfile[k];

                    pLits[0] = Abc_Var2Lit( Ses_ManSelectVar( pSes, i, j, k ), 1 );
                    pLits[1] = Abc_Var2Lit( Ses_ManDepthVar( pSes, i, d ), 0 );
                    sat_solver_addclause( pSes->pSat, pLits, pLits + 2 );
                }
        }
        else
            /* arrival times are 0 */
            Vec_IntPush( pSes->vAssump, Abc_Var2Lit( Ses_ManDepthVar( pSes, i, 0 ), 0 ) );

        /* reverse order encoding of depth variables */
        for ( j = 1; j <= pSes->nArrTimeMax + i; ++j )
        {
            pLits[0] = Abc_Var2Lit( Ses_ManDepthVar( pSes, i, j ), 1 );
            pLits[1] = Abc_Var2Lit( Ses_ManDepthVar( pSes, i, j - 1 ), 0 );
            sat_solver_addclause( pSes->pSat, pLits, pLits + 2 );
        }

        /* constrain maximum depth */
        if ( pSes->nMaxDepth < pSes->nArrTimeMax + i )
            for ( h = 0; h < pSes->nSpecFunc; ++h )
            {
                pLits[0] = Abc_Var2Lit( Ses_ManOutputVar( pSes, h, i ), 1 );
                pLits[1] = Abc_Var2Lit( Ses_ManDepthVar( pSes, i, pSes->nMaxDepth ), 1 );
                if ( !sat_solver_addclause( pSes->pSat, pLits, pLits + 2 ) )
                    return 0;
            }
    }

    return 1;
}